

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_P256.c
# Opt level: O2

void fsqr0(uint64_t *res,uint64_t *x)

{
  uint64_t tmp [8];
  uint64_t local_58 [9];
  
  local_58[6] = 0;
  local_58[7] = 0;
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  bn_sqr4(local_58,x);
  mont_reduction(res,local_58);
  return;
}

Assistant:

static inline void fsqr0(uint64_t *res, uint64_t *x)
{
  uint64_t tmp[8U] = { 0U };
  bn_sqr4(tmp, x);
  mont_reduction(res, tmp);
}